

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O0

void device_reset_ymz280b(void *info)

{
  undefined1 *puVar1;
  YMZ280BVoice *voice;
  int i;
  ymz280b_state *chip;
  void *info_local;
  
  for (voice._4_4_ = 0xff; -1 < voice._4_4_; voice._4_4_ = voice._4_4_ + -1) {
    if ((voice._4_4_ != 0x83) && ((voice._4_4_ < 0x88 || (0xfd < voice._4_4_)))) {
      *(char *)((long)info + 0x268) = (char)voice._4_4_;
      write_to_register((ymz280b_state *)info,'\0');
    }
  }
  *(undefined1 *)((long)info + 0x268) = 0;
  *(undefined1 *)((long)info + 0x269) = 0;
  *(undefined4 *)((long)info + 0x278) = 0;
  for (voice._4_4_ = 0; voice._4_4_ < 8; voice._4_4_ = voice._4_4_ + 1) {
    puVar1 = (undefined1 *)((long)info + (long)voice._4_4_ * 0x4c + 8);
    *(undefined2 *)(puVar1 + 0x46) = 0;
    *(undefined2 *)(puVar1 + 0x44) = 0;
    *(undefined4 *)(puVar1 + 0x40) = 0x4000;
    *puVar1 = 0;
  }
  return;
}

Assistant:

static void device_reset_ymz280b(void *info)
{
	ymz280b_state *chip = (ymz280b_state *)info;
	int i;

	/* initial clear registers */
	for (i = 0xff; i >= 0; i--)
	{
		if (i == 0x83 || (i >= 0x88 && i <= 0xFD))
			continue;	// avoid too many debug messages
		chip->current_register = i;
		write_to_register(chip, 0);
	}

	chip->current_register = 0;
	chip->status_register = 0;
	chip->ext_mem_address = 0;

	/* clear other voice parameters */
	for (i = 0; i < 8; i++)
	{
		struct YMZ280BVoice *voice = &chip->voice[i];

		voice->curr_sample = 0;
		voice->last_sample = 0;
		voice->output_pos = FRAC_ONE;
		voice->playing = 0;
	}
	
	return;
}